

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-semaphore.c
# Opt level: O0

int run_test_semaphore_3(void)

{
  int iVar1;
  undefined1 local_28 [8];
  uv_sem_t sem;
  
  iVar1 = uv_sem_init(local_28,3);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-semaphore.c"
            ,0x62,"0 == uv_sem_init(&sem, 3)");
    abort();
  }
  uv_sem_wait(local_28);
  uv_sem_wait(local_28);
  iVar1 = uv_sem_trywait(local_28);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-semaphore.c"
            ,0x65,"0 == uv_sem_trywait(&sem)");
    abort();
  }
  iVar1 = uv_sem_trywait(local_28);
  if (iVar1 != -0xb) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-semaphore.c"
            ,0x66,"UV_EAGAIN == uv_sem_trywait(&sem)");
    abort();
  }
  uv_sem_post(local_28);
  iVar1 = uv_sem_trywait(local_28);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-semaphore.c"
            ,0x69,"0 == uv_sem_trywait(&sem)");
    abort();
  }
  iVar1 = uv_sem_trywait(local_28);
  if (iVar1 != -0xb) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-semaphore.c"
            ,0x6a,"UV_EAGAIN == uv_sem_trywait(&sem)");
    abort();
  }
  uv_sem_destroy(local_28);
  return 0;
}

Assistant:

TEST_IMPL(semaphore_3) {
  uv_sem_t sem;

  ASSERT(0 == uv_sem_init(&sem, 3));
  uv_sem_wait(&sem); /* should not block */
  uv_sem_wait(&sem); /* should not block */
  ASSERT(0 == uv_sem_trywait(&sem));
  ASSERT(UV_EAGAIN == uv_sem_trywait(&sem));

  uv_sem_post(&sem);
  ASSERT(0 == uv_sem_trywait(&sem));
  ASSERT(UV_EAGAIN == uv_sem_trywait(&sem));

  uv_sem_destroy(&sem);

  return 0;
}